

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
* __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::insert
          (pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
           *__return_storage_ptr__,
          Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key,int *payload)

{
  longlong *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  pair<int,_int> pVar15;
  long lVar16;
  long lVar17;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  pair<int,_int> pVar18;
  data_node_type *leaf;
  int *piVar19;
  int max_fanout;
  uint uVar20;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *ppVar21;
  self_type **ppsVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 in_XMM0_Qa;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 in_XMM4_Qb;
  model_node_type *parent;
  int *local_d8;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *local_d0;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  traversal_path;
  Iterator local_48;
  
  iVar14 = *key;
  iVar13 = (this->istats_).key_domain_max_;
  local_d0 = __return_storage_ptr__;
  if (iVar13 < iVar14) {
    piVar19 = &(this->istats_).num_keys_above_key_domain;
    *piVar19 = *piVar19 + 1;
    bVar11 = should_expand_right(this);
LAB_00134b6c:
    if (bVar11 != false) {
      expand_root(this,*key,iVar14 <= iVar13);
    }
  }
  else if (iVar14 < (this->istats_).key_domain_min_) {
    piVar19 = &(this->istats_).num_keys_below_key_domain;
    *piVar19 = *piVar19 + 1;
    bVar11 = should_expand_left(this);
    goto LAB_00134b6c;
  }
  ppVar21 = local_d0;
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)this->root_node_;
  if ((this_00->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar14 = *key;
    auVar24._0_8_ = (double)iVar14;
    auVar24._8_8_ = in_XMM0_Qa;
    do {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = (this_00->super_AlexNode<int,_int>).model_.a_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = (this_00->super_AlexNode<int,_int>).model_.b_;
      auVar23 = vfmadd213sd_fma(auVar27,auVar24,auVar23);
      uVar20 = *(int *)&this_00->allocator_ - 1;
      dVar25 = auVar23._0_8_;
      uVar12 = ~((int)dVar25 >> 0x1f) & (int)dVar25;
      if ((int)uVar12 <= (int)uVar20) {
        uVar20 = uVar12;
      }
      this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)(&(this_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar20];
    } while ((this_00->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(this_00->super_AlexNode<int,_int>).level_;
    auVar24 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar25 + 0.5)));
    auVar9._8_8_ = 0x7fffffffffffffff;
    auVar9._0_8_ = 0x7fffffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar25 - auVar24._0_8_;
    auVar23 = vandpd_avx512vl(auVar34,auVar9);
    if (auVar23._0_8_ <= dVar25 * 2.220446049250313e-15) {
      if (auVar24._0_8_ <= dVar25) {
        if ((this_00->prev_leaf_ !=
             (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
              *)0x0) &&
           (iVar13 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                     ::last_key(this_00->prev_leaf_), iVar14 <= iVar13)) {
          ppsVar22 = &this_00->prev_leaf_;
          goto LAB_00134c42;
        }
      }
      else if ((this_00->next_leaf_ !=
                (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)0x0) &&
              (iVar13 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                        ::first_key(this_00->next_leaf_), iVar13 <= iVar14)) {
        ppsVar22 = &this_00->next_leaf_;
LAB_00134c42:
        this_00 = *ppsVar22;
      }
    }
  }
  local_d8 = key;
  pVar15 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
           insert(this_00,key,payload);
  iVar14 = pVar15.second;
  if (pVar15.first == 0) goto LAB_00135159;
  if (pVar15.first == -1) {
    Iterator::Iterator((Iterator *)&traversal_path,this_00,iVar14);
    (ppVar21->first).cur_leaf_ =
         (data_node_type *)
         traversal_path.
         super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)&(ppVar21->first).cur_idx_ =
         traversal_path.
         super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (ppVar21->first).cur_bitmap_data_ =
         (uint64_t)
         traversal_path.
         super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar21->second = false;
    return ppVar21;
  }
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  used_fanout_tree_nodes.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this->superroot_;
  iVar14 = *local_d8;
  used_fanout_tree_nodes.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)used_fanout_tree_nodes.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
  ::
  emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
              *)&traversal_path,(TraversalNode *)&used_fanout_tree_nodes);
  leaf = (data_node_type *)this->root_node_;
  if ((leaf->super_AlexNode<int,_int>).is_leaf_ == false) {
    do {
      auVar28._8_8_ = 0;
      auVar28._0_8_ = (leaf->super_AlexNode<int,_int>).model_.a_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = (double)iVar14;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (leaf->super_AlexNode<int,_int>).model_.b_;
      auVar24 = vfmadd213sd_fma(auVar28,auVar32,auVar4);
      uVar20 = *(int *)&leaf->allocator_ - 1;
      dVar25 = auVar24._0_8_;
      uVar12 = ~((int)dVar25 >> 0x1f) & (int)dVar25;
      if ((int)uVar12 <= (int)uVar20) {
        uVar20 = uVar12;
      }
      used_fanout_tree_nodes.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(used_fanout_tree_nodes.
                             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,uVar20);
      used_fanout_tree_nodes.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)leaf;
      std::
      vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
      ::
      emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>
                ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,false>::TraversalNode>>
                  *)&traversal_path,(TraversalNode *)&used_fanout_tree_nodes);
      leaf = (data_node_type *)
             (&(leaf->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar20];
    } while ((leaf->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(leaf->super_AlexNode<int,_int>).level_;
    auVar24 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar25 + 0.5)));
    dVar26 = auVar24._0_8_;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar25 - dVar26;
    auVar24 = vandpd_avx512vl(auVar29,auVar8);
    if (auVar24._0_8_ <= dVar25 * 2.220446049250313e-15) {
      if (dVar25 < dVar26) {
        if ((leaf->next_leaf_ !=
             (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
              *)0x0) &&
           (iVar13 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                     ::first_key(leaf->next_leaf_), iVar13 <= iVar14)) goto LAB_00134ddc;
      }
      else if ((leaf->prev_leaf_ !=
                (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)0x0) &&
              (iVar13 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                        ::last_key(leaf->prev_leaf_), iVar14 <= iVar13)) {
LAB_00134ddc:
        correct_traversal_path(this,leaf,&traversal_path,dVar26 <= dVar25);
      }
    }
  }
  parent = traversal_path.
           super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].node;
  pVar18 = pVar15;
  while( true ) {
    iVar14 = pVar18.second;
    iVar13 = pVar15.first;
    ppVar21 = local_d0;
    if (iVar13 == 0) break;
    lVar16 = std::chrono::_V2::system_clock::now();
    piVar19 = &(this->stats_).num_expand_and_scales;
    *piVar19 = *piVar19 + this_00->num_resizes_;
    if (parent == this->superroot_) {
      update_superroot_key_domain(this);
    }
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (parent->super_AlexNode<int,_int>).model_.a_;
    auVar33._0_8_ = (double)*local_d8;
    auVar33._8_8_ = in_XMM4_Qb;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (parent->super_AlexNode<int,_int>).model_.b_;
    auVar24 = vfmadd213sd_fma(auVar33,auVar30,auVar5);
    uVar20 = parent->num_children_ - 1;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar12 = ~((int)auVar24._0_8_ >> 0x1f) & (int)auVar24._0_8_;
    if ((int)uVar12 <= (int)uVar20) {
      uVar20 = uVar12;
    }
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar14 = (this->experimental_params_).splitting_policy_method;
    uVar12 = 1;
    if (iVar13 < 2 && iVar14 != 0) {
      max_fanout = 2;
      if (iVar14 != 1) {
        if (iVar14 != 2) goto LAB_00134ede;
        max_fanout = (this->derived_params_).max_fanout;
      }
      uVar12 = fanout_tree::find_best_fanout_existing_node<int,int>
                         (parent,uVar20,(this->stats_).num_keys,&used_fanout_tree_nodes,max_fanout);
    }
LAB_00134ede:
    lVar17 = std::chrono::_V2::system_clock::now();
    (this->stats_).cost_computation_time =
         (double)(lVar17 - lVar16) + (this->stats_).cost_computation_time;
    if (uVar12 == 0) {
      auVar31._0_8_ = (double)this_00->num_inserts_;
      uVar2 = this_00->num_right_out_of_bounds_inserts_;
      uVar3 = this_00->num_left_out_of_bounds_inserts_;
      auVar6._4_4_ = uVar3;
      auVar6._0_4_ = uVar2;
      auVar6._8_8_ = 0;
      auVar24 = vcvtdq2pd_avx(auVar6);
      auVar31._8_8_ = auVar31._0_8_;
      auVar24 = vdivpd_avx(auVar24,auVar31);
      auVar10._8_8_ = 0x3feccccccccccccd;
      auVar10._0_8_ = 0x3feccccccccccccd;
      uVar7 = vcmppd_avx512vl(auVar24,auVar10,0xe);
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::resize
                (this_00,0.6,true,(bool)((byte)(uVar7 & 3) & 1),SUB81((uVar7 & 3) >> 1,0));
      (this_00->super_AlexNode<int,_int>).cost_ =
           (used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start)->cost;
      dVar25 = (used_fanout_tree_nodes.
                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                ._M_impl.super__Vector_impl_data._M_start)->expected_avg_shifts;
      this_00->expected_avg_exp_search_iterations_ =
           (used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start)->expected_avg_search_iterations;
      this_00->expected_avg_shifts_ = dVar25;
      this_00->num_shifts_ = 0;
      this_00->num_exp_search_iterations_ = 0;
      *(undefined8 *)((long)&this_00->num_exp_search_iterations_ + 4) = 0;
      this_00->num_inserts_ = 0;
      this_00->num_resizes_ = 0;
      piVar19 = &(this->stats_).num_expand_and_retrains;
      *piVar19 = *piVar19 + 1;
      piVar19 = local_d8;
    }
    else {
      if ((this->experimental_params_).allow_splitting_upwards == true) {
        if ((this->experimental_params_).splitting_policy_method == 2) {
          __assert_fail("experimental_params_.splitting_policy_method != 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x4bc,
                        "std::pair<Iterator, bool> alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::insert(const T &, const P &) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                       );
        }
        iVar14 = best_split_propagation(this,&traversal_path,false);
        if ((this->superroot_->super_AlexNode<int,_int>).level_ < iVar14) {
          split_upwards(this,*local_d8,iVar14,&traversal_path,iVar13 == 3,&parent,false);
        }
        else {
          parent = split_downwards(this,parent,uVar20,uVar12,&used_fanout_tree_nodes,iVar13 == 3);
        }
      }
      else if (((this->derived_params_).max_fanout <
                (parent->num_children_ << (uVar12 & 0x1f)) /
                (1 << ((this_00->super_AlexNode<int,_int>).duplication_factor_ & 0x1f))) ||
              ((parent->super_AlexNode<int,_int>).level_ ==
               (this->superroot_->super_AlexNode<int,_int>).level_)) {
        parent = split_downwards(this,parent,uVar20,uVar12,&used_fanout_tree_nodes,iVar13 == 3);
      }
      else {
        split_sideways(this,parent,uVar20,uVar12,&used_fanout_tree_nodes,iVar13 == 3);
      }
      piVar19 = local_d8;
      this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::get_child_node
                             (parent,local_d8);
    }
    lVar17 = std::chrono::_V2::system_clock::now();
    (this->stats_).splitting_time = (double)(lVar17 - lVar16) + (this->stats_).splitting_time;
    pVar18 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             ::insert(this_00,piVar19,payload);
    iVar14 = pVar18.second;
    if (pVar18.first == -1) {
      Iterator::Iterator(&local_48,this_00,iVar14);
      ppVar21 = local_d0;
      (local_d0->first).cur_leaf_ = local_48.cur_leaf_;
      (local_d0->first).cur_idx_ = local_48.cur_idx_;
      (local_d0->first).cur_bitmap_idx_ = local_48.cur_bitmap_idx_;
      (local_d0->first).cur_bitmap_data_ = local_48.cur_bitmap_data_;
      local_d0->second = false;
      std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
      ~_Vector_base(&used_fanout_tree_nodes.
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                   );
      break;
    }
    std::_Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
    ~_Vector_base(&used_fanout_tree_nodes.
                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 );
    pVar15 = (pair<int,_int>)((ulong)pVar18 & 0xffffffff);
  }
  std::
  _Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ::~_Vector_base(&traversal_path.
                   super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 );
  if (iVar13 != 0) {
    return ppVar21;
  }
LAB_00135159:
  plVar1 = &(this->stats_).num_inserts;
  *plVar1 = *plVar1 + 1;
  (this->stats_).num_keys = (this->stats_).num_keys + 1;
  Iterator::Iterator((Iterator *)&traversal_path,this_00,iVar14);
  (ppVar21->first).cur_leaf_ =
       (data_node_type *)
       traversal_path.
       super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)&(ppVar21->first).cur_idx_ =
       traversal_path.
       super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (ppVar21->first).cur_bitmap_data_ =
       (uint64_t)
       traversal_path.
       super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar21->second = true;
  return ppVar21;
}

Assistant:

std::pair<Iterator, bool> insert(const T& key, const P& payload) {
    // If enough keys fall outside the key domain, expand the root to expand the
    // key domain
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain++;
      if (should_expand_right()) {
        expand_root(key, false);  // expand to the right
      }
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain++;
      if (should_expand_left()) {
        expand_root(key, true);  // expand to the left
      }
    }

    data_node_type* leaf = get_leaf(key);

    // Nonzero fail flag means that the insert did not happen
    std::pair<int, int> ret = leaf->insert(key, payload);
    int fail = ret.first;
    int insert_pos = ret.second;
    if (fail == -1) {
      // Duplicate found and duplicates not allowed
      return {Iterator(leaf, insert_pos), false};
    }

    // If no insert, figure out what to do with the data node to decrease the
    // cost
    if (fail) {
      std::vector<TraversalNode> traversal_path;
      get_leaf(key, &traversal_path);
      model_node_type* parent = traversal_path.back().node;

      while (fail) {
        auto start_time = std::chrono::high_resolution_clock::now();
        stats_.num_expand_and_scales += leaf->num_resizes_;

        if (parent == superroot_) {
          update_superroot_key_domain();
        }
        int bucketID = parent->model_.predict(key);
        bucketID = std::min<int>(std::max<int>(bucketID, 0),
                                 parent->num_children_ - 1);
        std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;

        int fanout_tree_depth = 1;
        if (experimental_params_.splitting_policy_method == 0 || fail >= 2) {
          // always split in 2. No extra work required here
        } else if (experimental_params_.splitting_policy_method == 1) {
          // decide between no split (i.e., expand and retrain) or splitting in
          // 2
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes, 2);
        } else if (experimental_params_.splitting_policy_method == 2) {
          // use full fanout tree to decide fanout
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes,
              derived_params_.max_fanout);
        }
        int best_fanout = 1 << fanout_tree_depth;
        stats_.cost_computation_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(
                std::chrono::high_resolution_clock::now() - start_time)
                .count();

        if (fanout_tree_depth == 0) {
          // expand existing data node and retrain model
          leaf->resize(data_node_type::kMinDensity_, true,
                       leaf->is_append_mostly_right(),
                       leaf->is_append_mostly_left());
          fanout_tree::FTNode& tree_node = used_fanout_tree_nodes[0];
          leaf->cost_ = tree_node.cost;
          leaf->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          leaf->expected_avg_shifts_ = tree_node.expected_avg_shifts;
          leaf->reset_stats();
          stats_.num_expand_and_retrains++;
        } else {
          // split data node: always try to split sideways/upwards, only split
          // downwards if necessary
          bool reuse_model = (fail == 3);
          if (experimental_params_.allow_splitting_upwards) {
            // allow splitting upwards
            assert(experimental_params_.splitting_policy_method != 2);
            int stop_propagation_level = best_split_propagation(traversal_path);
            if (stop_propagation_level <= superroot_->level_) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_upwards(key, stop_propagation_level, traversal_path,
                            reuse_model, &parent);
            }
          } else {
            // either split sideways or downwards
            bool should_split_downwards =
                (parent->num_children_ * best_fanout /
                         (1 << leaf->duplication_factor_) >
                     derived_params_.max_fanout ||
                 parent->level_ == superroot_->level_);
            if (should_split_downwards) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_sideways(parent, bucketID, fanout_tree_depth,
                             used_fanout_tree_nodes, reuse_model);
            }
          }
          leaf = static_cast<data_node_type*>(parent->get_child_node(key));
        }
        auto end_time = std::chrono::high_resolution_clock::now();
        auto duration = end_time - start_time;
        stats_.splitting_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(duration)
                .count();

        // Try again to insert the key
        ret = leaf->insert(key, payload);
        fail = ret.first;
        insert_pos = ret.second;
        if (fail == -1) {
          // Duplicate found and duplicates not allowed
          return {Iterator(leaf, insert_pos), false};
        }
      }
    }
    stats_.num_inserts++;
    stats_.num_keys++;
    return {Iterator(leaf, insert_pos), true};
  }